

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O0

void anon_unknown.dwarf_6334f::testAddOffset(void)

{
  float *pfVar1;
  float a;
  float b;
  float fVar2;
  M44f inRefMat;
  M44f outInRefMat;
  M44f invS;
  M44f invO;
  M44f outMat;
  M44f refMat;
  M44f inMat;
  V3f sOffset;
  V3f rOffset;
  V3f tOffset;
  V3f scaleB;
  V3f scaleA;
  V3f rotB;
  V3f rotA;
  V3f transB;
  V3f transA;
  int i;
  Rand48 random;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  float in_stack_fffffffffffffd70;
  float in_stack_fffffffffffffd74;
  Matrix44<float> *in_stack_fffffffffffffd80;
  Matrix44<float> *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  V3f *in_stack_fffffffffffffdb0;
  V3f *in_stack_fffffffffffffdb8;
  M44f *in_stack_fffffffffffffdc0;
  V3f *in_stack_fffffffffffffdd0;
  V3f *in_stack_fffffffffffffdd8;
  V3f *in_stack_fffffffffffffde0;
  Rand48 *in_stack_fffffffffffffde8;
  Vec3<float> *in_stack_fffffffffffffe78;
  Matrix44<float> *in_stack_fffffffffffffe80;
  Matrix44<float> *in_stack_fffffffffffffe98;
  Vec3<float> *in_stack_fffffffffffffea0;
  Vec3<float> *in_stack_fffffffffffffea8;
  Vec3<float> *in_stack_fffffffffffffeb0;
  Matrix44<float> *in_stack_fffffffffffffeb8;
  Vec3<float> local_78;
  Vec3<float> local_6c;
  Vec3<float> local_60;
  Vec3<float> local_54;
  Vec3<float> local_48;
  Vec3<float> local_3c;
  Vec3<float> local_30;
  Vec3<float> local_24;
  Vec3<float> local_18;
  int local_c;
  
  Imath_2_5::Rand48::Rand48
            ((Rand48 *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  for (local_c = 0; local_c < 100000; local_c = local_c + 1) {
    Imath_2_5::Vec3<float>::Vec3(&local_18);
    Imath_2_5::Vec3<float>::Vec3(&local_24);
    Imath_2_5::Vec3<float>::Vec3(&local_30);
    Imath_2_5::Vec3<float>::Vec3(&local_3c);
    Imath_2_5::Vec3<float>::Vec3(&local_48);
    Imath_2_5::Vec3<float>::Vec3(&local_54);
    Imath_2_5::Vec3<float>::Vec3(&local_60);
    Imath_2_5::Vec3<float>::Vec3(&local_6c);
    Imath_2_5::Vec3<float>::Vec3(&local_78);
    createRandomMat(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                    in_stack_fffffffffffffdd0);
    createRandomMat(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                    in_stack_fffffffffffffdd0);
    getRandTRS((Rand48 *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               in_stack_fffffffffffffdb0,
               (V3f *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
    Imath_2_5::addOffset<float>
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    Imath_2_5::Matrix44<float>::Matrix44
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    pfVar1 = Imath_2_5::Vec3<float>::operator[](&local_6c,0);
    a = rad(*pfVar1);
    pfVar1 = Imath_2_5::Vec3<float>::operator[](&local_6c,1);
    b = rad(*pfVar1);
    pfVar1 = Imath_2_5::Vec3<float>::operator[](&local_6c,2);
    fVar2 = rad(*pfVar1);
    Imath_2_5::Vec3<float>::Vec3((Vec3<float> *)&stack0xfffffffffffffe7c,a,b,fVar2);
    Imath_2_5::Matrix44<float>::rotate<float>(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    pfVar1 = Imath_2_5::Vec3<float>::operator[](&local_60,0);
    in_stack_fffffffffffffd70 = *pfVar1;
    pfVar1 = Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)&stack0xfffffffffffffe88,3);
    *pfVar1 = in_stack_fffffffffffffd70;
    pfVar1 = Imath_2_5::Vec3<float>::operator[](&local_60,1);
    in_stack_fffffffffffffd74 = *pfVar1;
    pfVar1 = Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)&stack0xfffffffffffffe88,3);
    pfVar1[1] = in_stack_fffffffffffffd74;
    pfVar1 = Imath_2_5::Vec3<float>::operator[](&local_60,2);
    fVar2 = *pfVar1;
    pfVar1 = Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)&stack0xfffffffffffffe88,3);
    pfVar1[2] = fVar2;
    Imath_2_5::Matrix44<float>::invert
              ((Matrix44<float> *)in_stack_fffffffffffffdb0,(bool)in_stack_fffffffffffffdaf);
    Imath_2_5::Matrix44<float>::Matrix44
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    Imath_2_5::Matrix44<float>::scale<float>
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (Vec3<float> *)CONCAT44(a,b));
    Imath_2_5::Matrix44<float>::invert
              ((Matrix44<float> *)in_stack_fffffffffffffdb0,(bool)in_stack_fffffffffffffdaf);
    Imath_2_5::Matrix44<float>::operator*(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    Imath_2_5::Matrix44<float>::operator*(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    Imath_2_5::Matrix44<float>::operator*(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    compareMat(in_stack_fffffffffffffdc0,(M44f *)in_stack_fffffffffffffdb8);
  }
  return;
}

Assistant:

void
testAddOffset()
{
    Rand48 random(0);

    for (int i = 0; i < 100000; ++i)
    {
        debug (("iteration: %d\n", i));

        V3f transA, transB, rotA, rotB, scaleA, scaleB;
        V3f tOffset, rOffset, sOffset;
        M44f inMat  = createRandomMat(random, transA, rotA, scaleA);
        M44f refMat = createRandomMat(random, transB, rotB, scaleB);
        getRandTRS(random, tOffset, rOffset, sOffset);
        
        // addOffset : function to test
        M44f outMat = addOffset( inMat, tOffset, rOffset, sOffset, refMat);
        
        // add the inverse offset
        M44f invO;
        invO.rotate (V3f(rad(rOffset[0]), rad(rOffset[1]), rad(rOffset[2])));
        invO[3][0] = tOffset[0];
        invO[3][1] = tOffset[1];
        invO[3][2] = tOffset[2];
        invO.invert();

        M44f invS;
        invS.scale (sOffset);
        invS.invert(); // zero scale is avoided in getRandTRS
        
        // in ref mat from the function result
        M44f outInRefMat = invO*invS*outMat;
        
        // in ref mat from the inputs
        M44f inRefMat    = inMat*refMat;
        
        // compare the mat
        compareMat(outInRefMat, inRefMat);
    }
}